

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
* GatherSamplers(unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 *__return_storage_ptr__,Animation *anim)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  reference pvVar5;
  AnimationSamplers *sampler;
  uint local_2c;
  reference pvStack_28;
  uint node_index;
  Channel *channel;
  uint c;
  Animation *anim_local;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  *samplers;
  
  channel._7_1_ = 0;
  _c = anim;
  anim_local = (Animation *)__return_storage_ptr__;
  std::
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  ::unordered_map(__return_storage_ptr__);
  for (channel._0_4_ = 0; uVar2 = (ulong)(uint)channel,
      sVar3 = std::vector<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>::
              size(&_c->channels), uVar2 < sVar3; channel._0_4_ = (uint)channel + 1) {
    pvStack_28 = std::vector<glTF2::Animation::Channel,_std::allocator<glTF2::Animation::Channel>_>
                 ::operator[](&_c->channels,(ulong)(uint)channel);
    iVar1 = pvStack_28->sampler;
    sVar3 = std::vector<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>::size
                      (&_c->samplers);
    if (iVar1 < (int)sVar3) {
      local_2c = glTF2::Ref<glTF2::Node>::GetIndex(&(pvStack_28->target).node);
      pmVar4 = std::
               unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
               ::operator[](__return_storage_ptr__,&local_2c);
      if ((pvStack_28->target).path == AnimationPath_TRANSLATION) {
        pvVar5 = std::vector<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                 ::operator[](&_c->samplers,(long)pvStack_28->sampler);
        pmVar4->translation = pvVar5;
      }
      else if ((pvStack_28->target).path == AnimationPath_ROTATION) {
        pvVar5 = std::vector<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                 ::operator[](&_c->samplers,(long)pvStack_28->sampler);
        pmVar4->rotation = pvVar5;
      }
      else if ((pvStack_28->target).path == AnimationPath_SCALE) {
        pvVar5 = std::vector<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                 ::operator[](&_c->samplers,(long)pvStack_28->sampler);
        pmVar4->scale = pvVar5;
      }
      else if ((pvStack_28->target).path == AnimationPath_WEIGHTS) {
        pvVar5 = std::vector<glTF2::Animation::Sampler,_std::allocator<glTF2::Animation::Sampler>_>
                 ::operator[](&_c->samplers,(long)pvStack_28->sampler);
        pmVar4->weight = pvVar5;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<unsigned int, AnimationSamplers> GatherSamplers(Animation& anim)
{
    std::unordered_map<unsigned int, AnimationSamplers> samplers;
    for (unsigned int c = 0; c < anim.channels.size(); ++c) {
        Animation::Channel& channel = anim.channels[c];
        if (channel.sampler >= static_cast<int>(anim.samplers.size())) {
            continue;
        }

        const unsigned int node_index = channel.target.node.GetIndex();

        AnimationSamplers& sampler = samplers[node_index];
        if (channel.target.path == AnimationPath_TRANSLATION) {
            sampler.translation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_ROTATION) {
            sampler.rotation = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_SCALE) {
            sampler.scale = &anim.samplers[channel.sampler];
        } else if (channel.target.path == AnimationPath_WEIGHTS) {
            sampler.weight = &anim.samplers[channel.sampler];
        }
    }

    return samplers;
}